

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::CommentInfo::setComment(CommentInfo *this,char *text,size_t len)

{
  char *__dest;
  size_t __n;
  ostringstream oss;
  string sStack_1b8;
  string local_198 [11];
  
  if (this->comment_ != (char *)0x0) {
    free(this->comment_);
    this->comment_ = (char *)0x0;
  }
  if (text == (char *)0x0) {
    local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"assert json failed","");
    throwLogicError(local_198);
  }
  if ((*text != '\0') && (*text != '/')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"in Json::Value::setComment(): Comments must start with /",0x38)
    ;
    std::__cxx11::stringbuf::str();
    throwLogicError(&sStack_1b8);
  }
  __n = 0x7ffffffe;
  if (len < 0x7ffffffe) {
    __n = len;
  }
  __dest = (char *)malloc(__n + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,text,__n);
    __dest[__n] = '\0';
    this->comment_ = __dest;
    return;
  }
  local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,
             "in Json::Value::duplicateStringValue(): Failed to allocate string value buffer","");
  throwRuntimeError(local_198);
}

Assistant:

void Value::CommentInfo::setComment(const char* text, size_t len) {
  if (comment_) {
    releaseStringValue(comment_, 0u);
    comment_ = 0;
  }
  JSON_ASSERT(text != 0);
  JSON_ASSERT_MESSAGE(
      text[0] == '\0' || text[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  // It seems that /**/ style comments are acceptable as well.
  comment_ = duplicateStringValue(text, len);
}